

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<56,Blob<224>>
               (hashfunc<Blob<224>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  uint uVar1;
  bool bVar2;
  pfHash p_Var3;
  reference pvVar4;
  size_type sVar5;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar6;
  uint in_ESI;
  undefined4 in_R8D;
  bool result;
  keytype k;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  bool in_stack_0000009b;
  bool in_stack_0000009c;
  bool in_stack_0000009d;
  bool in_stack_0000009e;
  bool in_stack_0000009f;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_000000a0;
  undefined4 in_stack_ffffffffffffffc0;
  byte bVar7;
  undefined4 in_stack_ffffffffffffffc4;
  Blob<56> *in_stack_ffffffffffffffc8;
  undefined1 local_2f [6];
  uint8_t in_stack_ffffffffffffffd7;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  pointer in_stack_ffffffffffffffe0;
  hashfunc local_8 [8];
  
  uVar1 = in_EDX & 1;
  pcVar6 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar6 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x38,pcVar6,(ulong)in_ESI);
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)0x185f31);
  Blob<56>::Blob((Blob<56> *)local_2f);
  memset(local_2f,0,7);
  if (uVar1 != 0) {
    std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::resize
              ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),CONCAT44(in_ESI,in_EDX)
              );
    p_Var3 = hashfunc::operator_cast_to_function_pointer(local_8);
    pvVar4 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[]
                       ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)&stack0xffffffffffffffd8,0
                       );
    (*p_Var3)(local_2f,7,0,pvVar4);
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<56>,Blob<224>>
            ((pfHash)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
             (bool)in_stack_ffffffffffffffd7,in_stack_ffffffffffffffc8,
             (vector<Blob<224>,_std::allocator<Blob<224>_>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  sVar5 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size
                    ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)&stack0xffffffffffffffd8);
  printf("%d keys\n",sVar5 & 0xffffffff);
  bVar7 = 1;
  bVar2 = TestHashList<Blob<224>>
                    (in_stack_000000a0,in_stack_0000009f,in_stack_0000009e,in_stack_0000009d,
                     in_stack_0000009c,in_stack_0000009b);
  bVar7 = bVar2 & bVar7;
  printf("\n");
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)CONCAT44(in_ECX,in_R8D));
  return (bool)(bVar7 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}